

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O1

int class_decrement_reference(klass cls)

{
  atomic_uintmax_t aVar1;
  int iVar2;
  
  iVar2 = 1;
  if ((cls != (klass)0x0) && (aVar1 = (cls->ref).count, aVar1 != 0)) {
    LOCK();
    (cls->ref).count = (cls->ref).count - 1;
    UNLOCK();
    if (aVar1 != 0) {
      LOCK();
      class_stats.decrements = class_stats.decrements + 1;
      UNLOCK();
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int class_decrement_reference(klass cls)
{
	if (cls == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_decrement(&cls->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_decrement(class_stats);

	return 0;
}